

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LagrangePolynomial.cpp
# Opt level: O2

vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> * __thiscall
LagrangePolynomial::get_lagrange_polynomial
          (vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>
           *__return_storage_ptr__,LagrangePolynomial *this,
          vector<int,_std::allocator<int>_> *data_points,
          vector<poly,_std::allocator<poly>_> *basis_polynomial)

{
  ulong uVar1;
  long lVar2;
  LagrangePolynomial *this_00;
  element temp;
  value_type local_70;
  LagrangePolynomial local_48 [24];
  
  (__return_storage_ptr__->
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(data_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(data_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
    local_70.p.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.p.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.p.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_70.p,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&(((basis_polynomial->super__Vector_base<poly,_std::allocator<poly>_>).
                             _M_impl.super__Vector_impl_data._M_start)->numerators).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + lVar2));
    this_00 = local_48;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_48,
               (vector<int,_std::allocator<int>_> *)
               ((long)&(((basis_polynomial->super__Vector_base<poly,_std::allocator<poly>_>)._M_impl
                         .super__Vector_impl_data._M_start)->denominators).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar2));
    local_70.denominator = find_product(this_00,(vector<int,_std::allocator<int>_> *)local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_48);
    local_70.multiple =
         (int64_t)(data_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar1];
    std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::
    push_back(__return_storage_ptr__,&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70.p);
    lVar2 = lVar2 + 0x30;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LagrangePolynomial::element> LagrangePolynomial::get_lagrange_polynomial(vector<int> data_points, vector<poly> basis_polynomial) {
    vector<element> result_polynomial;

    for(int i=0; i<data_points.size(); i++){
        element temp;
        
        temp.p = basis_polynomial[i].numerators;
        temp.denominator = find_product(basis_polynomial[i].denominators);
        temp.multiple = data_points[i];

        result_polynomial.push_back(temp);
    }

    return result_polynomial;
}